

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

iterator __thiscall
boost::unordered::detail::foa::
table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
::begin(table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
        *this)

{
  slot_type *psVar1;
  uint uVar2;
  slot_type *psVar3;
  ushort uVar4;
  slot_type *psVar5;
  value_type_pointer ppVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  
  psVar3 = ((this->
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            ).arrays.groups_)->m;
  ppVar6 = (this->
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
           ).arrays.elements_;
  if (ppVar6 == (value_type_pointer)0x0) {
LAB_001397ce:
    iVar12.p_ = (table_element_pointer)0x0;
    iVar12.pc_ = &psVar3->n;
    return iVar12;
  }
  auVar7[0] = -(psVar3->n == '\0');
  auVar7._1_7_ = 0;
  auVar7[8] = -(psVar3[8].n == '\0');
  auVar7[9] = -(psVar3[9].n == '\0');
  auVar7[10] = -(psVar3[10].n == '\0');
  auVar7[0xb] = -(psVar3[0xb].n == '\0');
  auVar7[0xc] = -(psVar3[0xc].n == '\0');
  auVar7[0xd] = -(psVar3[0xd].n == '\0');
  auVar7[0xe] = -(*(char *)(psVar3 + 0xe) == '\0');
  auVar7[0xf] = -(*(char *)(psVar3 + 0xf) == '\0');
  psVar5 = psVar3;
  if ((auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    do {
      ppVar6 = ppVar6 + 1;
      if (((uint)psVar5 & 0xf) == 0xe) {
        auVar8[0] = -(psVar3[2].n == '\0');
        auVar8[1] = -(psVar3[3].n == '\0');
        auVar8[2] = -(psVar3[4].n == '\0');
        auVar8[3] = -(psVar3[5].n == '\0');
        auVar8[4] = -(psVar3[6].n == '\0');
        auVar8[5] = -(psVar3[7].n == '\0');
        auVar8[6] = -(psVar3[8].n == '\0');
        auVar8[7] = -(psVar3[9].n == '\0');
        auVar8[8] = -(psVar3[10].n == '\0');
        auVar8[9] = -(psVar3[0xb].n == '\0');
        auVar8[10] = -(psVar3[0xc].n == '\0');
        auVar8[0xb] = -(psVar3[0xd].n == '\0');
        auVar8[0xc] = -(psVar3[0xe].n == '\0');
        auVar8[0xd] = -(psVar3[0xf].n == '\0');
        auVar8[0xe] = -(((group_type_pointer)(psVar3 + 0x10))->m[0].n == '\0');
        auVar8[0xf] = -(psVar3[0x11].n == '\0');
        uVar4 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe;
        if (uVar4 == 0x7fff) {
          psVar5 = psVar3 + 0x12;
          do {
            psVar3 = psVar5;
            ppVar6 = ppVar6 + 0xf;
            auVar9[0] = -(psVar3->n == '\0');
            auVar9[1] = -(psVar3[1].n == '\0');
            auVar9[2] = -(psVar3[2].n == '\0');
            auVar9[3] = -(psVar3[3].n == '\0');
            auVar9[4] = -(psVar3[4].n == '\0');
            auVar9[5] = -(psVar3[5].n == '\0');
            auVar9[6] = -(psVar3[6].n == '\0');
            auVar9[7] = -(psVar3[7].n == '\0');
            auVar9[8] = -(psVar3[8].n == '\0');
            auVar9[9] = -(psVar3[9].n == '\0');
            auVar9[10] = -(psVar3[10].n == '\0');
            auVar9[0xb] = -(psVar3[0xb].n == '\0');
            auVar9[0xc] = -(psVar3[0xc].n == '\0');
            auVar9[0xd] = -(psVar3[0xd].n == '\0');
            auVar9[0xe] = -(*(char *)(psVar3 + 0xe) == '\0');
            auVar9[0xf] = -(*(char *)(psVar3 + 0xf) == '\0');
            uVar4 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe;
            psVar5 = psVar3 + 0x10;
          } while (uVar4 == 0x7fff);
        }
        else {
          psVar3 = psVar3 + 2;
        }
        uVar2 = 0;
        if ((uVar4 ^ 0x7fff) != 0) {
          for (; ((uVar4 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        if (psVar3[uVar2].n != '\x01') {
          iVar11.pc_ = psVar3 + uVar2;
          iVar11.p_ = (table_element_pointer)((long)&(ppVar6->first)._M_len + (ulong)(uVar2 << 5));
          return iVar11;
        }
        goto LAB_001397ce;
      }
      psVar1 = psVar3 + 1;
      psVar3 = psVar3 + 1;
      psVar5 = psVar5 + 1;
    } while (psVar1->n == '\0');
    if (psVar1->n == '\x01') goto LAB_001397ce;
  }
  iVar10.p_ = ppVar6;
  iVar10.pc_ = &psVar3->n;
  return iVar10;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }